

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BindCommand.cpp
# Opt level: O3

void __thiscall BindCommand::doCommand(BindCommand *this)

{
  long lVar1;
  pointer pcVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  undefined8 uVar5;
  size_type *__return_storage_ptr__;
  ulong uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined1 local_70 [8];
  string nameInSimulator;
  string varName;
  
  uVar3 = DataCommands::getIndex(this->dataCommands);
  uVar6 = uVar3 + 1;
  __return_storage_ptr__ = (size_type *)((long)&nameInSimulator.field_2 + 8);
  DataCommands::getSeparated_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__return_storage_ptr__,this->dataCommands);
  if (uVar6 < (ulong)((long)varName._M_dataplus._M_p - nameInSimulator.field_2._8_8_ >> 5)) {
    __return_storage_ptr__ = &nameInSimulator._M_string_length;
    lVar1 = *(long *)(nameInSimulator.field_2._8_8_ + uVar6 * 0x20);
    local_70 = (undefined1  [8])__return_storage_ptr__;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,lVar1,
               *(long *)(nameInSimulator.field_2._8_8_ + 8 + uVar6 * 0x20) + lVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&nameInSimulator.field_2 + 8));
    uVar4 = DataCommands::getIndex(this->dataCommands);
    DataCommands::getSeparated_abi_cxx11_(&local_88,this->dataCommands);
    uVar6 = uVar4 - 2;
    if (uVar6 < (ulong)((long)local_88.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_88.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      pcVar2 = local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_dataplus._M_p;
      nameInSimulator.field_2._8_8_ = &varName._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&nameInSimulator.field_2 + 8),pcVar2,
                 pcVar2 + local_88.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      DataBinds::addNewBind
                (this->dataBinds,(string *)local_70,(string *)((long)&nameInSimulator.field_2 + 8));
      DataCommands::setIndex(this->dataCommands,uVar3 + 2);
      if ((size_type *)nameInSimulator.field_2._8_8_ != &varName._M_string_length) {
        operator_delete((void *)nameInSimulator.field_2._8_8_,varName._M_string_length + 1);
      }
      if (local_70 != (undefined1  [8])__return_storage_ptr__) {
        operator_delete((void *)local_70,nameInSimulator._M_string_length + 1);
      }
      return;
    }
  }
  else {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
  }
  uVar5 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar6);
  if (local_70 != (undefined1  [8])__return_storage_ptr__) {
    operator_delete((void *)local_70,nameInSimulator._M_string_length + 1);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

void BindCommand::doCommand() {
    // get the index from dataCommands
    unsigned long index = this->dataCommands->getIndex();
    // skip the command
    index++;
    // get the nameInSimulator from the vector in dataCommands
    string nameInSimulator = this->dataCommands->getSeparated().at(index);
    // skip the nameInSimulator
    index++;
    unsigned long indexOfVarName = this->dataCommands->getIndex() - 2;
    // get the varName from the vector in dataCommands
    string varName = this->dataCommands->getSeparated().at(indexOfVarName);
    // add to the varToNameInSimulator map
    this->dataBinds->addNewBind(nameInSimulator, varName);
    // set the new index of dataCommands
    this->dataCommands->setIndex(index);
}